

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall Js::FunctionBody::TraceExecutionMode(FunctionBody *this,char *eventDescription)

{
  bool bVar1;
  uint sourceContextId;
  LocalFunctionId functionId;
  char *eventDescription_local;
  FunctionBody *this_local;
  
  FunctionExecutionStateMachine::AssertIsInitialized(&this->executionState);
  sourceContextId = FunctionProxy::GetSourceContextId((FunctionProxy *)this);
  functionId = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this);
  bVar1 = Phases::IsEnabled((Phases *)&DAT_01ec1678,ExecutionModePhase,sourceContextId,functionId);
  if (bVar1) {
    DoTraceExecutionMode(this,eventDescription);
  }
  return;
}

Assistant:

void FunctionBody::TraceExecutionMode(const char *const eventDescription) const
    {
        executionState.AssertIsInitialized();

        if(PHASE_TRACE(Phase::ExecutionModePhase, this))
        {
            DoTraceExecutionMode(eventDescription);
        }
    }